

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

Point3fi * __thiscall
pbrt::Point3fi::operator-
          (Point3fi *__return_storage_ptr__,Point3fi *this,Vector3<pbrt::Interval> *v)

{
  Interval IVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  IVar1 = (v->super_Tuple3<pbrt::Vector3,_pbrt::Interval>).x;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = IVar1.low;
  auVar6._4_4_ = IVar1.high;
  auVar6 = vmovshdup_avx(auVar6);
  fVar2 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low -
          auVar6._0_4_;
  auVar6 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < fVar2) {
    auVar5._0_12_ = ZEXT812(0);
    auVar5._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar5,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar2 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar2);
    auVar6 = ZEXT416((int)fVar2 + -1 + (uint)(fVar2 <= 0.0) * 2);
  }
  fVar2 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high -
          IVar1.low;
  auVar5 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar2 < INFINITY) {
    auVar7._0_12_ = ZEXT812(0);
    auVar7._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar7,0);
    fVar2 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar2);
    auVar5 = ZEXT416((-(uint)(fVar2 < 0.0) | 1) + (int)fVar2);
  }
  IVar1 = (v->super_Tuple3<pbrt::Vector3,_pbrt::Interval>).y;
  auVar9._8_8_ = 0;
  auVar9._0_4_ = IVar1.low;
  auVar9._4_4_ = IVar1.high;
  auVar7 = vmovshdup_avx(auVar9);
  fVar2 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low -
          auVar7._0_4_;
  auVar7 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < fVar2) {
    auVar8._0_12_ = ZEXT812(0);
    auVar8._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar8,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar2 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar2);
    auVar7 = ZEXT416((int)fVar2 + -1 + (uint)(fVar2 <= 0.0) * 2);
  }
  fVar2 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high -
          IVar1.low;
  auVar9 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar2 < INFINITY) {
    auVar10._0_12_ = ZEXT812(0);
    auVar10._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar10,0);
    fVar2 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar2);
    auVar9 = ZEXT416((-(uint)(fVar2 < 0.0) | 1) + (int)fVar2);
  }
  IVar1 = (v->super_Tuple3<pbrt::Vector3,_pbrt::Interval>).z;
  auVar12._8_8_ = 0;
  auVar12._0_4_ = IVar1.low;
  auVar12._4_4_ = IVar1.high;
  auVar8 = vmovshdup_avx(auVar12);
  fVar2 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low -
          auVar8._0_4_;
  auVar8 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < fVar2) {
    auVar11._0_12_ = ZEXT812(0);
    auVar11._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar11,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar2 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar2);
    auVar8 = ZEXT416((int)fVar2 + -1 + (uint)(fVar2 <= 0.0) * 2);
  }
  fVar2 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high -
          IVar1.low;
  auVar10 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar2 < INFINITY) {
    auVar13._0_12_ = ZEXT812(0);
    auVar13._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar13,0);
    fVar2 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar2);
    auVar10 = ZEXT416((-(uint)(fVar2 < 0.0) | 1) + (int)fVar2);
  }
  auVar12 = vminss_avx(auVar9,auVar7);
  auVar7 = vmaxss_avx(auVar9,auVar7);
  auVar9 = vminss_avx(auVar5,auVar6);
  auVar5 = vmaxss_avx(auVar5,auVar6);
  auVar11 = vminss_avx(auVar10,auVar8);
  auVar6 = vinsertps_avx(auVar12,auVar7,0x10);
  auVar5 = vinsertps_avx(auVar9,auVar5,0x10);
  auVar5 = vmovlhps_avx(auVar5,auVar6);
  auVar6 = vmaxss_avx(auVar10,auVar8);
  (__return_storage_ptr__->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
  x.low = (Float)(int)auVar5._0_8_;
  (__return_storage_ptr__->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
  x.high = (Float)(int)((ulong)auVar5._0_8_ >> 0x20);
  (__return_storage_ptr__->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
  y.low = (Float)(int)auVar5._8_8_;
  (__return_storage_ptr__->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
  y.high = (Float)(int)((ulong)auVar5._8_8_ >> 0x20);
  auVar6 = vinsertps_avx(auVar11,auVar6,0x10);
  IVar1 = (Interval)vmovlps_avx(auVar6);
  (__return_storage_ptr__->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
  z = IVar1;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU Point3fi operator-(const Vector3<U> &v) const {
        DCHECK(!v.HasNaN());
        return {x - v.x, y - v.y, z - v.z};
    }